

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

bool __thiscall helics::CoreBroker::verifyBrokerKey(CoreBroker *this,ActionMessage *mess)

{
  bool bVar1;
  string *psVar2;
  string_view key;
  
  if (0x20 < (ulong)((long)(mess->stringData).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(mess->stringData).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    psVar2 = ActionMessage::getString_abi_cxx11_(mess,1);
    key._M_str = (psVar2->_M_dataplus)._M_p;
    key._M_len = psVar2->_M_string_length;
    bVar1 = verifyBrokerKey(this,key);
    return bVar1;
  }
  return (this->super_BrokerBase).brokerKey._M_string_length == 0;
}

Assistant:

bool CoreBroker::verifyBrokerKey(ActionMessage& mess) const
{
    if (mess.getStringData().size() > 1) {
        return verifyBrokerKey(mess.getString(1));
    }
    return brokerKey.empty();
}